

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.cpp
# Opt level: O0

string * __thiscall
yactfr::internal::BeginReadScopeInstr::_toStr_abi_cxx11_
          (string *__return_storage_ptr__,BeginReadScopeInstr *this,Size indent)

{
  ostream *poVar1;
  Scope scope;
  string local_298;
  allocator local_271;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream ss;
  Size indent_local;
  BeginReadScopeInstr *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198," ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e8,"scope",&local_1e9);
  _strProp(&local_1c8,&local_1e8);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c8);
  (anonymous_namespace)::scopeStr_abi_cxx11_
            (&local_230,(_anonymous_namespace_ *)(ulong)*(uint *)&(this->super_Instr).field_0xc,
             scope);
  anon_unknown_8::_strScopeName(&local_210,&local_230);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1," ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_270,"align",&local_271);
  _strProp(&local_250,&local_270);
  poVar1 = std::operator<<(poVar1,(string *)&local_250);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->_align);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  Proc::toStr_abi_cxx11_(&local_298,&this->_proc,indent + 1);
  std::operator<<((ostream *)local_198,(string *)&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string BeginReadScopeInstr::_toStr(const Size indent) const
{
    std::ostringstream ss;

    ss << " " << _strProp("scope") << _strScopeName(scopeStr(_scope)) <<
          " " << _strProp("align") << _align << std::endl;
    ss << _proc.toStr(indent + 1);
    return ss.str();
}